

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O2

void __thiscall testing::internal::ExpectationBase::~ExpectationBase(ExpectationBase *this)

{
  this->_vptr_ExpectationBase = (_func_int **)&PTR__ExpectationBase_00147b78;
  Mutex::~Mutex(&this->mutex_);
  std::_Vector_base<const_void_*,_std::allocator<const_void_*>_>::~_Vector_base
            (&(this->untyped_actions_).
              super__Vector_base<const_void_*,_std::allocator<const_void_*>_>);
  std::
  _Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
  ::~_Rb_tree((_Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
               *)&this->immediate_prerequisites_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->cardinality_).impl_.
              super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

ExpectationBase::~ExpectationBase() = default;